

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.hpp
# Opt level: O2

size_t __thiscall websocketpp::http::parser::response::consume(response *this,char *buf,size_t len)

{
  size_t *psVar1;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ulong uVar2;
  char *pcVar3;
  size_t sVar4;
  element_type *peVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  string *psVar6;
  istream *piVar7;
  exception *peVar8;
  ptrdiff_t _Num;
  iterator begin;
  char *pcVar9;
  pointer pcVar10;
  allocator local_241;
  char *local_240;
  string length;
  string local_218;
  char *local_1f8;
  string local_1f0;
  string local_1d0;
  istringstream ss;
  
  if (this->m_state == DONE) {
    pcVar9 = (char *)0x0;
  }
  else {
    if (this->m_state == BODY) {
      sVar4 = process_body(this,buf,len);
      return sVar4;
    }
    this_00 = &this->m_buf;
    local_240 = (char *)len;
    local_1f8 = buf;
    std::__cxx11::string::append
              ((char *)(this->m_buf).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(ulong)buf);
    peVar5 = (this->m_buf).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar10 = (peVar5->_M_dataplus)._M_p;
    begin._M_current = pcVar10;
    while( true ) {
      end = std::
            __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (begin._M_current,pcVar10 + peVar5->_M_string_length,"\r\n","");
      uVar2 = (this->super_parser).m_header_bytes + 3 +
              ((long)end._M_current - (long)begin._M_current);
      (this->super_parser).m_header_bytes = uVar2;
      if (16000 < uVar2) {
        peVar8 = (exception *)__cxa_allocate_exception(0x70);
        std::__cxx11::string::string
                  ((string *)&ss,"Maximum header size exceeded.",(allocator *)&local_1f0);
        length._M_dataplus._M_p = (pointer)&length.field_2;
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        length._M_string_length = 0;
        local_218._M_string_length = 0;
        length.field_2._M_local_buf[0] = '\0';
        local_218.field_2._M_local_buf[0] = '\0';
        exception::exception
                  (peVar8,(string *)&ss,request_header_fields_too_large,&length,&local_218);
        __cxa_throw(peVar8,&exception::typeinfo,exception::~exception);
      }
      peVar5 = (this_00->
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      pcVar10 = (peVar5->_M_dataplus)._M_p;
      if (end._M_current == pcVar10 + peVar5->_M_string_length) {
        if (end._M_current != begin._M_current) {
          memmove(pcVar10,begin._M_current,(long)end._M_current - (long)begin._M_current);
          peVar5 = (this_00->
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
        }
        std::__cxx11::string::resize((ulong)peVar5);
        this->m_read = (size_t)(local_240 + this->m_read);
        psVar1 = &(this->super_parser).m_header_bytes;
        *psVar1 = *psVar1 - ((this->m_buf).
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->_M_string_length;
        return (size_t)local_240;
      }
      if (end._M_current == begin._M_current) break;
      if (this->m_state == RESPONSE_LINE) {
        process(this,begin,(iterator)end._M_current);
        this->m_state = HEADERS;
      }
      else {
        parser::process_header(&this->super_parser,begin,(iterator)end._M_current);
      }
      peVar5 = (this_00->
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      begin._M_current = end._M_current + 2;
      pcVar10 = (peVar5->_M_dataplus)._M_p;
    }
    if (this->m_state == RESPONSE_LINE) {
      peVar8 = (exception *)__cxa_allocate_exception(0x70);
      std::__cxx11::string::string((string *)&ss,"Incomplete Request",(allocator *)&local_1f0);
      length._M_dataplus._M_p = (pointer)&length.field_2;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      length._M_string_length = 0;
      local_218._M_string_length = 0;
      length.field_2._M_local_buf[0] = '\0';
      local_218.field_2._M_local_buf[0] = '\0';
      exception::exception(peVar8,(string *)&ss,bad_request,&length,&local_218);
      __cxa_throw(peVar8,&exception::typeinfo,exception::~exception);
    }
    std::__cxx11::string::string((string *)&ss,"Content-Length",(allocator *)&local_218);
    pcVar3 = local_240;
    psVar6 = parser::get_header(&this->super_parser,(string *)&ss);
    std::__cxx11::string::string((string *)&length,(string *)psVar6);
    std::__cxx11::string::~string((string *)&ss);
    if (length._M_string_length == 0) {
      this->m_read = 0;
    }
    else {
      std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&length,_S_in);
      piVar7 = std::istream::_M_extract<unsigned_long>((ulong *)&ss);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        peVar8 = (exception *)__cxa_allocate_exception(0x70);
        std::__cxx11::string::string
                  ((string *)&local_218,"Unable to parse Content-Length header",&local_241);
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        local_1f0._M_string_length = 0;
        local_1d0._M_string_length = 0;
        local_1f0.field_2._M_local_buf[0] = '\0';
        local_1d0.field_2._M_local_buf[0] = '\0';
        exception::exception(peVar8,&local_218,bad_request,&local_1f0,&local_1d0);
        __cxa_throw(peVar8,&exception::typeinfo,exception::~exception);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
    }
    this->m_state = BODY;
    peVar5 = (this->m_buf).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar9 = end._M_current +
             (long)(pcVar3 + (2 - (long)((peVar5->_M_dataplus)._M_p + peVar5->_M_string_length)));
    if (pcVar9 <= pcVar3 && (long)pcVar3 - (long)pcVar9 != 0) {
      sVar4 = process_body(this,local_1f8 + (long)pcVar9,(long)pcVar3 - (long)pcVar9);
      pcVar9 = pcVar9 + sVar4;
    }
    std::
    __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ::reset(&this_00->
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           );
    std::__cxx11::string::~string((string *)&length);
  }
  return (size_t)pcVar9;
}

Assistant:

inline size_t response::consume(char const * buf, size_t len) {
    if (m_state == DONE) {return 0;}

    if (m_state == BODY) {
        return this->process_body(buf,len);
    }

    // copy new header bytes into buffer
    m_buf->append(buf,len);

    // Search for delimiter in buf. If found read until then. If not read all
    std::string::iterator begin = m_buf->begin();
    std::string::iterator end = begin;


    for (;;) {
        // search for delimiter
        end = std::search(
            begin,
            m_buf->end(),
            header_delimiter,
            header_delimiter + sizeof(header_delimiter) - 1
        );

        m_header_bytes += (end-begin+sizeof(header_delimiter));
        
        if (m_header_bytes > max_header_size) {
            // exceeded max header size
            throw exception("Maximum header size exceeded.",
                status_code::request_header_fields_too_large);
        }

        if (end == m_buf->end()) {
            // we are out of bytes. Discard the processed bytes and copy the
            // remaining unprecessed bytes to the beginning of the buffer
            std::copy(begin,end,m_buf->begin());
            m_buf->resize(static_cast<std::string::size_type>(end-begin));

            m_read += len;
            m_header_bytes -= m_buf->size();

            return len;
        }

        //the range [begin,end) now represents a line to be processed.

        if (end-begin == 0) {
            // we got a blank line
            if (m_state == RESPONSE_LINE) {
                throw exception("Incomplete Request",status_code::bad_request);
            }

            // TODO: grab content-length
            std::string length = get_header("Content-Length");

            if (length.empty()) {
                // no content length found, read indefinitely
                m_read = 0;
            } else {
                std::istringstream ss(length);

                if ((ss >> m_read).fail()) {
                    throw exception("Unable to parse Content-Length header",
                                    status_code::bad_request);
                }
            }

            m_state = BODY;

            // calc header bytes processed (starting bytes - bytes left)
            size_t read = (
                len - static_cast<std::string::size_type>(m_buf->end() - end)
                + sizeof(header_delimiter) - 1
            );

            // if there were bytes left process them as body bytes
            if (read < len) {
                read += this->process_body(buf+read,(len-read));
            }

            // frees memory used temporarily during header parsing
            m_buf.reset();

            return read;
        } else {
            if (m_state == RESPONSE_LINE) {
                this->process(begin,end);
                m_state = HEADERS;
            } else {
                this->process_header(begin,end);
            }
        }

        begin = end+(sizeof(header_delimiter) - 1);
    }
}